

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::DiffParser::ProcessLine(DiffParser *this)

{
  string *this_00;
  char cVar1;
  int iVar2;
  DiffFieldType DVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (*(this->super_LineParser).Line._M_dataplus._M_p == ':') {
    this->DiffField = DiffFieldChange;
    local_40 = 0;
    local_38 = 0;
    (this->CurChange).Action = '?';
    local_48 = &local_38;
    std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  DVar3 = this->DiffField;
  if (DVar3 == DiffFieldDst) {
LAB_0030eefc:
    std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
LAB_0030ef11:
    DVar3 = DiffFieldNone;
  }
  else {
    if (DVar3 != DiffFieldSrc) {
      if (DVar3 != DiffFieldChange) {
        return true;
      }
      pcVar5 = (this->super_LineParser).Line._M_dataplus._M_p;
      DVar3 = DiffFieldNone;
      if ((*pcVar5 == ':') && (cVar6 = pcVar5[1], cVar6 != '\0')) {
        pcVar5 = pcVar5 + 2;
        do {
          iVar2 = isspace((int)cVar6);
          if (iVar2 != 0) goto LAB_0030eeb0;
          cVar6 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar6 != '\0');
      }
      goto LAB_0030ef90;
    }
    cVar6 = (this->CurChange).Action;
    if (cVar6 == 'R') {
      (this->CurChange).Action = 'D';
      this_00 = &(this->CurChange).Path;
      std::__cxx11::string::_M_assign((string *)this_00);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      local_40 = 0;
      local_38 = 0;
      (this->CurChange).Action = 'A';
      local_48 = &local_38;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
    }
    else {
      if (cVar6 != 'C') goto LAB_0030eefc;
      (this->CurChange).Action = 'A';
    }
    DVar3 = DiffFieldDst;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030eeb0:
    iVar2 = isspace((int)cVar6);
    if (iVar2 == 0) goto LAB_0030eece;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030eece:
    iVar2 = isspace((int)cVar6);
    if (iVar2 != 0) goto LAB_0030ef20;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030ef20:
    iVar2 = isspace((int)cVar6);
    if (iVar2 == 0) goto LAB_0030efad;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030efad:
    iVar2 = isspace((int)cVar6);
    if (iVar2 != 0) goto LAB_0030efc7;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030efc7:
    iVar2 = isspace((int)cVar6);
    if (iVar2 == 0) goto LAB_0030efe1;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030efe1:
    iVar2 = isspace((int)cVar6);
    if (iVar2 != 0) goto LAB_0030effb;
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar6 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    if (cVar6 == '\0') break;
LAB_0030effb:
    iVar2 = isspace((int)cVar6);
    if (iVar2 == 0) {
      lVar4 = 0;
      cVar1 = cVar6;
      goto LAB_0030f00e;
    }
  }
  goto LAB_0030ef90;
  while( true ) {
    cVar1 = *pcVar5;
    lVar4 = lVar4 + -1;
    pcVar5 = pcVar5 + 1;
    if (cVar1 == '\0') break;
LAB_0030f00e:
    iVar2 = isspace((int)cVar1);
    if (iVar2 != 0) {
      if (lVar4 == 0) goto LAB_0030ef11;
      break;
    }
  }
  (this->CurChange).Action = cVar6;
  DVar3 = DiffFieldSrc;
LAB_0030ef90:
  this->DiffField = DVar3;
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line[0] == ':') {
      this->DiffField = DiffFieldChange;
      this->CurChange = Change();
    }
    if (this->DiffField == DiffFieldChange) {
      // :src-mode dst-mode src-sha1 dst-sha1 status
      if (this->Line[0] != ':') {
        this->DiffField = DiffFieldNone;
        return true;
      }
      const char* src_mode_first = this->Line.c_str() + 1;
      const char* src_mode_last = this->ConsumeField(src_mode_first);
      const char* dst_mode_first = this->ConsumeSpace(src_mode_last);
      const char* dst_mode_last = this->ConsumeField(dst_mode_first);
      const char* src_sha1_first = this->ConsumeSpace(dst_mode_last);
      const char* src_sha1_last = this->ConsumeField(src_sha1_first);
      const char* dst_sha1_first = this->ConsumeSpace(src_sha1_last);
      const char* dst_sha1_last = this->ConsumeField(dst_sha1_first);
      const char* status_first = this->ConsumeSpace(dst_sha1_last);
      const char* status_last = this->ConsumeField(status_first);
      if (status_first != status_last) {
        this->CurChange.Action = *status_first;
        this->DiffField = DiffFieldSrc;
      } else {
        this->DiffField = DiffFieldNone;
      }
    } else if (this->DiffField == DiffFieldSrc) {
      // src-path
      if (this->CurChange.Action == 'C') {
        // Convert copy to addition of destination.
        this->CurChange.Action = 'A';
        this->DiffField = DiffFieldDst;
      } else if (this->CurChange.Action == 'R') {
        // Convert rename to deletion of source and addition of destination.
        this->CurChange.Action = 'D';
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);

        this->CurChange = Change('A');
        this->DiffField = DiffFieldDst;
      } else {
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);
        this->DiffField = this->DiffFieldNone;
      }
    } else if (this->DiffField == DiffFieldDst) {
      // dst-path
      this->CurChange.Path = this->Line;
      this->Changes.push_back(this->CurChange);
      this->DiffField = this->DiffFieldNone;
    }
    return true;
  }